

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_goiftrue(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int l2;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  l2 = -1;
  if ((2 < eVar1 - VK) && (eVar1 != VTRUE)) {
    if (eVar1 == VJMP) {
      negatecondition(fs,e);
      l2 = (e->u).info;
    }
    else {
      l2 = jumponcond(fs,e,0);
    }
  }
  luaK_concat(fs,&e->f,l2);
  luaK_patchtohere(fs,e->t);
  e->t = -1;
  return;
}

Assistant:

void luaK_goiftrue(FuncState *fs, expdesc *e) {
    int pc;  /* pc of new jump */
    luaK_dischargevars(fs, e);
    switch (e->k) {
        case VJMP: {  /* condition? */
            negatecondition(fs, e);  /* jump when it is false */
            pc = e->u.info;  /* save jump position */
            break;
        }
        case VK:
        case VKFLT:
        case VKINT:
        case VTRUE: {
            pc = NO_JUMP;  /* always true; do nothing */
            break;
        }
        default: {
            pc = jumponcond(fs, e, 0);  /* jump when false */
            break;
        }
    }
    luaK_concat(fs, &e->f, pc);  /* insert new jump in false list */
    luaK_patchtohere(fs, e->t);  /* true list jumps to here (to go through) */
    e->t = NO_JUMP;
}